

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_dns_name.c
# Opt level: O0

ares_buf_t * ares_dns_labels_add(ares_array_t *labels)

{
  ares_status_t aVar1;
  ares_buf_t *paVar2;
  long *local_20;
  ares_buf_t **buf;
  ares_array_t *labels_local;
  
  if (labels == (ares_array_t *)0x0) {
    labels_local = (ares_array_t *)0x0;
  }
  else {
    buf = (ares_buf_t **)labels;
    aVar1 = ares_array_insert_last(&local_20,labels);
    if (aVar1 == ARES_SUCCESS) {
      paVar2 = ares_buf_create();
      *local_20 = (long)paVar2;
      if (*local_20 == 0) {
        ares_array_remove_last((ares_array_t *)buf);
        labels_local = (ares_array_t *)0x0;
      }
      else {
        labels_local = (ares_array_t *)*local_20;
      }
    }
    else {
      labels_local = (ares_array_t *)0x0;
    }
  }
  return (ares_buf_t *)labels_local;
}

Assistant:

static ares_buf_t *ares_dns_labels_add(ares_array_t *labels)
{
  ares_buf_t **buf;

  if (labels == NULL) {
    return NULL; /* LCOV_EXCL_LINE: DefensiveCoding */
  }

  if (ares_array_insert_last((void **)&buf, labels) != ARES_SUCCESS) {
    return NULL;
  }

  *buf = ares_buf_create();
  if (*buf == NULL) {
    ares_array_remove_last(labels);
    return NULL;
  }

  return *buf;
}